

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::
ContainmentError<int,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (Assert *this,string *msg,string *msg2,int value,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  ulong uVar1;
  ostream *poVar2;
  string local_218 [32];
  Assert *local_1f8;
  int *local_1f0;
  Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_> local_1e8;
  outputter<UnitTests::Assert::Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_1d8;
  expected_got_outputter<int> local_1d0 [3];
  expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  ostringstream local_1b0 [8];
  ostringstream s;
  int local_34;
  string *psStack_30;
  int value_local;
  string *msg2_local;
  string *msg_local;
  Assert *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  local_34 = value;
  psStack_30 = msg2;
  msg2_local = msg;
  msg_local = (string *)this;
  this_local = (Assert *)end._M_current;
  end_local = begin;
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_1b8 = stream<std::__cxx11::string>(msg2_local);
    poVar2 = details::operator<<((ostream *)local_1b0,&local_1b8);
    std::operator<<(poVar2,". ");
  }
  poVar2 = std::operator<<((ostream *)local_1b0,(string *)psStack_30);
  std::operator<<(poVar2," ");
  local_1d0[0] = stream<int>(&local_34);
  details::operator<<((ostream *)local_1b0,local_1d0);
  std::operator<<((ostream *)local_1b0,", actual contents :\n\t");
  local_1f0 = end_local._M_current;
  local_1f8 = this_local;
  Range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::Range
            (&local_1e8,end_local,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this_local);
  local_1d8 = stream_any<UnitTests::Assert::Range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
                        (&local_1e8);
  stream_any_details::operator<<((ostream *)local_1b0,&local_1d8);
  std::operator<<((ostream *)local_1b0,"\n");
  std::__cxx11::ostringstream::str();
  Error(this,local_218);
}

Assistant:

[[noreturn]] void ContainmentError(const std::string& msg, const std::string& msg2, Value value,
            ContainerIterator begin, ContainerIterator end) const {
            auto s = std::ostringstream{};
            if (!msg.empty())
                s << stream(msg) << ". ";

            s << msg2 << " ";
            s << stream(value);
            s << ", actual contents :\n\t";
            s << stream_any(Range<ContainerIterator>(begin, end));
            s << "\n";
            Error(s.str());
        }